

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall fmt::v10::detail::print(detail *this,FILE *f,string_view text)

{
  uint uVar1;
  char *pcVar2;
  undefined8 uVar3;
  uint *puVar4;
  string_view fmt;
  
  pcVar2 = (char *)fwrite(f,1,(size_t)text.data_,(FILE *)this);
  if (text.data_ <= pcVar2) {
    return;
  }
  uVar3 = __cxa_allocate_exception(0x20);
  puVar4 = (uint *)__errno_location();
  uVar1 = *puVar4;
  check_format_string<FMT_COMPILE_STRING,_0>();
  fmt.data_ = (char *)(ulong)uVar1;
  fmt.size_ = (size_t)"cannot write to file";
  vsystem_error((int)uVar3,fmt,(format_args)ZEXT816(0x14));
  __cxa_throw(uVar3,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

FMT_FUNC void print(std::FILE* f, string_view text) {
  if (!write_console(f, text)) fwrite_fully(text.data(), 1, text.size(), f);
}